

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O2

int setsockopt(int __fd,int __level,int __optname,void *__optval,socklen_t __optlen)

{
  uchar *puVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  timeval *val;
  long lStack_30;
  
  if (g_sys_setsockopt_func == (setsockopt_pfn_t)0x0) {
    g_sys_setsockopt_func = (setsockopt_pfn_t)dlsym(0xffffffffffffffff,"setsockopt");
  }
  bVar3 = co_is_enable_sys_hook();
  if ((bVar3 && (uint)__fd < 1000000) &&
     (__level == 1 && g_rpchook_socket_fd[(uint)__fd] != (rpchook_t *)0x0)) {
    if (__optname == 0x14) {
      lStack_30 = 0x18;
    }
    else {
      if (__optname != 0x15) goto LAB_00105b64;
      lStack_30 = 0x28;
    }
    uVar2 = *(undefined8 *)((long)__optval + 8);
    puVar1 = (g_rpchook_socket_fd[(uint)__fd]->dest).sin_zero + lStack_30 + -0xc;
    *(undefined8 *)puVar1 = *__optval;
    *(undefined8 *)(puVar1 + 8) = uVar2;
  }
LAB_00105b64:
  iVar4 = (*g_sys_setsockopt_func)(__fd,__level,__optname,__optval,__optlen);
  return iVar4;
}

Assistant:

int setsockopt(int fd, int level, int option_name,
			                 const void *option_value, socklen_t option_len)
{
	HOOK_SYS_FUNC( setsockopt );

	if( !co_is_enable_sys_hook() )
	{
		return g_sys_setsockopt_func( fd,level,option_name,option_value,option_len );
	}
	rpchook_t *lp = get_by_fd( fd );

	if( lp && SOL_SOCKET == level )
	{
		struct timeval *val = (struct timeval*)option_value;
		if( SO_RCVTIMEO == option_name  ) 
		{
			memcpy( &lp->read_timeout,val,sizeof(*val) );
		}
		else if( SO_SNDTIMEO == option_name )
		{
			memcpy( &lp->write_timeout,val,sizeof(*val) );
		}
	}
	return g_sys_setsockopt_func( fd,level,option_name,option_value,option_len );
}